

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O1

void nn_random_generate(void *buf,size_t len)

{
  size_t __n;
  
  nn_random_state = nn_random_state * 0x41c64e6d + 0x3039;
  __n = 8;
  if (len < 8) {
    __n = len;
  }
  memcpy(buf,&nn_random_state,__n);
  if (8 < len) {
    nn_random_generate_cold_1();
  }
  return;
}

Assistant:

void nn_random_generate (void *buf, size_t len)
{
    uint8_t *pos;

    pos = (uint8_t*) buf;

    while (1) {

        /*  Generate a pseudo-random integer. */
        nn_random_state = nn_random_state * 1103515245 + 12345;

        /*  Move the bytes to the output buffer. */
        memcpy (pos, &nn_random_state, len > 8 ? 8 : len);
        if (nn_fast (len <= 8))
            return;
        len -= 8;
        pos += 8;
    }
}